

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

Time __thiscall helics::Federate::requestTime(Federate *this,Time nextInternalTimeStep)

{
  Modes MVar1;
  element_type *peVar2;
  Time newTime;
  InvalidFunctionCall *this_00;
  string_view message;
  undefined4 extraout_var;
  
  MVar1 = (this->currentMode)._M_i;
  if ((MVar1 != FINISHED) && (MVar1 != FINALIZE)) {
    if (MVar1 != EXECUTING) {
      this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      message._M_str = "cannot call request time in present state";
      message._M_len = 0x29;
      InvalidFunctionCall::InvalidFunctionCall(this_00,message);
      __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
    }
    do {
      if ((this->timeRequestEntryCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
        ::operator()(&this->timeRequestEntryCallback,
                     (TimeRepresentation<count_time<9,_long>_>)(this->mCurrentTime).internalTimeCode
                     ,(TimeRepresentation<count_time<9,_long>_>)
                      nextInternalTimeStep.internalTimeCode,false);
      }
      peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      newTime.internalTimeCode._0_4_ =
           (*peVar2->_vptr_Core[0x1a])
                     (peVar2,(ulong)(uint)(this->fedID).fid,nextInternalTimeStep.internalTimeCode);
      newTime.internalTimeCode._4_4_ = extraout_var;
      postTimeRequestOperations(this,newTime,false);
      if (this->retriggerTimeRequest != true) {
        return (Time)newTime.internalTimeCode;
      }
    } while (newTime.internalTimeCode != 0x7fffffffffffffff);
  }
  return (Time)0x7fffffffffffffff;
}

Assistant:

Time Federate::requestTime(Time nextInternalTimeStep)
{
    switch (currentMode) {
        case Modes::EXECUTING:
            try {
                Time newTime;
                do {
                    preTimeRequestOperations(nextInternalTimeStep, false);
                    newTime = coreObject->timeRequest(fedID, nextInternalTimeStep);
                    postTimeRequestOperations(newTime, false);
                } while (retriggerTimeRequest && newTime < Time::maxVal());

                return newTime;
            }
            catch (const FunctionExecutionFailure&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            catch (const RegistrationFailure&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            break;
        case Modes::FINALIZE:
        case Modes::FINISHED:
            return Time::maxVal();
        default:
            break;
    }

    throw(InvalidFunctionCall("cannot call request time in present state"));
}